

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O0

bool __thiscall
pg::PTLSolver::search_rec(PTLSolver *this,bitset *Region,int vtop,int player,bitset *Subgame)

{
  uint *__s;
  undefined1 __first [8];
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  _label_vertex _Var6;
  bool local_419;
  bool local_3b2;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0 [8];
  string px_1;
  _label_vertex local_2a0;
  bitset local_290;
  _label_vertex local_270;
  size_t local_260;
  size_t v_3;
  undefined1 local_248 [24];
  undefined1 local_230 [4];
  int v_2;
  undefined1 local_220 [16];
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0 [8];
  string px;
  int *local_190;
  int *curedge;
  Game *pGStack_180;
  bool closed_region;
  int local_178;
  _label_vertex local_170;
  Game *local_160;
  int local_158;
  _label_vertex local_150;
  size_t local_140;
  size_t v_1;
  undefined1 local_130 [4];
  int v;
  uint local_120;
  int local_11c;
  int pl;
  int pr;
  uint local_104;
  undefined1 local_100 [4];
  int top;
  undefined1 local_f0 [8];
  bitset Lower;
  undefined1 local_c0 [8];
  bitset Z;
  bitset Y;
  bool changes;
  bitset *Subgame_local;
  int player_local;
  int vtop_local;
  bitset *Region_local;
  PTLSolver *this_local;
  char local_11;
  bitset *local_10;
  
  Y._allocsize._7_1_ = false;
  bitset::bitset((bitset *)&Z._allocsize,Region);
  sVar3 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)local_c0,sVar3);
  bitset::bitset((bitset *)local_f0,Subgame);
  bitset::operator[]((bitset *)local_100,(size_t)&Z._allocsize);
  bitset::reference::operator=((reference *)local_100,false);
  local_104 = vtop - 1;
  do {
    if (local_104 == 0xffffffff) {
      bitset::~bitset((bitset *)local_f0);
      bitset::~bitset((bitset *)local_c0);
      bitset::~bitset((bitset *)&Z._allocsize);
      return Y._allocsize._7_1_;
    }
    bitset::operator[]((bitset *)&pl,(size_t)&Z._allocsize);
    bVar1 = bitset::reference::operator_cast_to_bool((reference *)&pl);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_11c = Solver::priority(&this->super_Solver,local_104);
      local_120 = Solver::priority(&this->super_Solver,local_104);
      local_120 = local_120 & 1;
      if (local_120 == player) {
        bitset::operator[]((bitset *)local_130,(size_t)local_c0);
        bitset::reference::operator=((reference *)local_130,true);
        this->str[(int)local_104] = -1;
        iVar2 = (this->Q).pointer;
        (this->Q).pointer = iVar2 + 1;
        (this->Q).queue[iVar2] = local_104;
        while ((this->Q).pointer != 0) {
          iVar2 = (this->Q).pointer + -1;
          (this->Q).pointer = iVar2;
          v_1._4_4_ = (this->Q).queue[iVar2];
          attractVertices(this,player,v_1._4_4_,(bitset *)&Z._allocsize,(bitset *)local_c0,
                          (bitset *)local_f0);
          attractTangles(this,player,v_1._4_4_,(bitset *)&Z._allocsize,(bitset *)local_c0,
                         (bitset *)local_f0);
        }
        if (1 < (this->super_Solver).trace) {
          poVar4 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m \x1b[1;36m");
          poVar4 = std::operator<<(poVar4,(string *)&this->path);
          poVar4 = std::operator<<(poVar4,"-");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_11c);
          std::operator<<(poVar4,"\x1b[m");
          for (local_140 = bitset::find_first((bitset *)local_c0); local_140 != 0xffffffffffffffff;
              local_140 = bitset::find_next((bitset *)local_c0,local_140)) {
            poVar4 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
            _Var6 = Solver::label_vertex(&this->super_Solver,(int)local_140);
            local_160 = _Var6.g;
            local_158 = _Var6.v;
            local_150.g = local_160;
            local_150.v = local_158;
            poVar4 = operator<<(poVar4,&local_150);
            std::operator<<(poVar4,"\x1b[m");
            if (this->str[local_140] != -1) {
              poVar4 = std::operator<<((this->super_Solver).logger,"->");
              _Var6 = Solver::label_vertex(&this->super_Solver,this->str[local_140]);
              pGStack_180 = _Var6.g;
              local_178 = _Var6.v;
              local_170.g = pGStack_180;
              local_170.v = local_178;
              operator<<(poVar4,&local_170);
            }
          }
          std::ostream::operator<<
                    ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
        }
        curedge._7_1_ = 1;
        iVar2 = Solver::owner(&this->super_Solver,local_104);
        if (iVar2 == player) {
          if (this->str[(int)local_104] == -1) {
            curedge._7_1_ = 0;
          }
        }
        else {
          for (local_190 = Solver::outs(&this->super_Solver,local_104); *local_190 != -1;
              local_190 = local_190 + 1) {
            bitset::operator[]((bitset *)&stack0xfffffffffffffe60,(size_t)local_c0);
            bVar1 = bitset::reference::operator_cast_to_bool((reference *)&stack0xfffffffffffffe60);
            local_3b2 = false;
            if (!bVar1) {
              bitset::operator[]((bitset *)((long)&px.field_2 + 8),(size_t)local_f0);
              local_3b2 = bitset::reference::operator_cast_to_bool
                                    ((reference *)((long)&px.field_2 + 8));
            }
            if (local_3b2 != false) {
              curedge._7_1_ = 0;
              break;
            }
          }
        }
        if ((curedge._7_1_ & 1) == 0) {
          std::__cxx11::string::string(local_1d0,(string *)&this->path);
          std::__cxx11::to_string((string *)(local_220 + 0x10),local_11c);
          std::operator+(&local_1f0,"-",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_220 + 0x10));
          std::__cxx11::string::operator+=((string *)&this->path,(string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)(local_220 + 0x10));
          bVar1 = search_rec(this,(bitset *)local_c0,local_104,player,(bitset *)local_f0);
          Y._allocsize._7_1_ = (bool)(Y._allocsize._7_1_ | bVar1);
          std::__cxx11::string::operator=((string *)&this->path,local_1d0);
          std::__cxx11::string::~string(local_1d0);
        }
        else {
          __s = this->pea_vidx;
          lVar5 = Solver::nodecount(&this->super_Solver);
          memset(__s,0,lVar5 << 2);
          this->pea_curidx = 1;
          bVar1 = extractTangles(this,local_104,(bitset *)local_c0,this->str);
          Y._allocsize._7_1_ = Y._allocsize._7_1_ != false || bVar1;
        }
        bitset::operator-=((bitset *)&Z._allocsize,(bitset *)local_c0);
        bitset::operator-=((bitset *)local_f0,(bitset *)local_c0);
      }
      else {
        bitset::operator[]((bitset *)local_220,(size_t)&Z._allocsize);
        bitset::reference::operator=((reference *)local_220,false);
        bitset::operator[]((bitset *)local_230,(size_t)local_c0);
        bitset::reference::operator=((reference *)local_230,true);
        this->str[vtop] = -1;
        iVar2 = (this->Q).pointer;
        (this->Q).pointer = iVar2 + 1;
        (this->Q).queue[iVar2] = vtop;
        while ((this->Q).pointer != 0) {
          iVar2 = (this->Q).pointer + -1;
          (this->Q).pointer = iVar2;
          local_248._20_4_ = (this->Q).queue[iVar2];
          attractVertices(this,player,local_248._20_4_,(bitset *)&Z._allocsize,(bitset *)local_c0,
                          (bitset *)local_f0);
          attractTangles(this,player,local_248._20_4_,(bitset *)&Z._allocsize,(bitset *)local_c0,
                         (bitset *)local_f0);
        }
        bitset::swap((bitset *)&Z._allocsize,(bitset *)local_c0);
        bitset::operator[]((bitset *)local_248,(size_t)&Z._allocsize);
        bitset::reference::operator=((reference *)local_248,false);
        bitset::operator-=((bitset *)local_c0,(bitset *)&Z._allocsize);
        bitset::operator[]((bitset *)&v_3,(size_t)local_c0);
        bitset::reference::operator=((reference *)&v_3,true);
        if (1 < (this->super_Solver).trace) {
          poVar4 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m \x1b[1;36m");
          poVar4 = std::operator<<(poVar4,(string *)&this->path);
          poVar4 = std::operator<<(poVar4,"-");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_11c);
          std::operator<<(poVar4,"\x1b[m");
          for (local_260 = bitset::find_last((bitset *)local_c0); local_260 != 0xffffffffffffffff;
              local_260 = bitset::find_prev((bitset *)local_c0,local_260)) {
            poVar4 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
            _Var6 = Solver::label_vertex(&this->super_Solver,(int)local_260);
            local_290._bitssize = (size_t)_Var6.g;
            local_290._allocsize._0_4_ = _Var6.v;
            local_270.g = (Game *)local_290._bitssize;
            local_270.v = (int)local_290._allocsize;
            poVar4 = operator<<(poVar4,&local_270);
            std::operator<<(poVar4,"\x1b[m");
            local_419 = false;
            if (this->str[local_260] != -1) {
              bitset::operator[](&local_290,(size_t)local_c0);
              local_419 = bitset::reference::operator_cast_to_bool((reference *)&local_290);
            }
            if (local_419 != false) {
              poVar4 = std::operator<<((this->super_Solver).logger,"->");
              _Var6 = Solver::label_vertex(&this->super_Solver,this->str[local_260]);
              px_1.field_2._8_8_ = _Var6.g;
              local_2a0.v = _Var6.v;
              local_2a0.g = (Game *)px_1.field_2._8_8_;
              operator<<(poVar4,&local_2a0);
            }
          }
          std::ostream::operator<<
                    ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
        }
        std::__cxx11::string::string(local_2d0,(string *)&this->path);
        std::__cxx11::to_string(&local_310,local_11c);
        std::operator+(&local_2f0,"-",&local_310);
        std::__cxx11::string::operator+=((string *)&this->path,(string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_310);
        bVar1 = search_rec(this,(bitset *)local_c0,local_104,player,(bitset *)local_f0);
        Y._allocsize._7_1_ = (bool)(Y._allocsize._7_1_ | bVar1);
        std::__cxx11::string::operator=((string *)&this->path,local_2d0);
        std::__cxx11::string::~string(local_2d0);
      }
      __first = local_c0;
      local_10 = (bitset *)local_c0;
      sVar3 = bitset::num_blocks(local_10);
      local_11 = '\0';
      std::fill<unsigned_long*,char>
                ((unsigned_long *)__first,(unsigned_long *)((long)__first + sVar3 * 8),&local_11);
    }
    local_104 = local_104 - 1;
  } while( true );
}

Assistant:

bool
PTLSolver::search_rec(bitset &Region, int vtop, int player, bitset &Subgame)
{
    bool changes = false; // whether we found tangles/dominions

    bitset Y(Region); // the remaining subgame of <R>
    bitset Z(nodecount()); // move me
    bitset Lower(Subgame);

#if 0 /**/
    // First, attract to the open "exit" for the opponent
    // That is, remove Attr(top) from <Y>.

    Z[vtop] = true; // add to <Z>
    str[vtop] = -1;
    Q.push(vtop);

    while (Q.nonempty()) {
        const int v = Q.pop();
        attractVertices(1-player, v, Y, Z, Y);
        if (multiplayer) attractTangles(1-player, v, Y, Z, Y);
    }

    Y -= Z;
    Z.reset();
#else
    Y[vtop] = false; // ensure <vtop> is never attracted...
    // Lower[vtop] = false; // and that 
#endif

    /////////////////
    // After each iteration:
    // <Y> and <Lower> are updated, removing subregions
    // if top is "good": attract to Z, remove from <Y> and <Lower>
    // if <Z> is a "bad" ... ..
    /////////////////

    for (int top=vtop-1; top!=-1; top--) {
        // find next top below <vtop> in Y
        if (!Y[top]) continue;

        /*
        logger << "Contents of Y:";
        for (auto v = Y.find_first(); v != bitset::npos; v = Y.find_next(v)) logger << " " << label_vertex(v);
        logger << std::endl;
        logger << "Contents of Lower:";
        for (auto v = Lower.find_first(); v != bitset::npos; v = Lower.find_next(v)) logger << " " << label_vertex(v);
        logger << std::endl;
        */

        const int pr = priority(top);
        const int pl = priority(top)&1;

        if (pl == player) {
            Z[top] = true; // add to <Z>
            str[top] = -1;
            Q.push(top);

            while (Q.nonempty()) {
                const int v = Q.pop();
                attractVertices(player, v, Y, Z, Lower);
                attractTangles(player, v, Y, Z, Lower);
            }

#ifndef NDEBUG
            if (trace >= 2) {
                // report region
                logger << "\033[1;33mregion\033[m \033[1;36m" << path << "-" << pr << "\033[m";
                for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
                logger << std::endl;
            }
#endif

            /**
             * Now Z is the lowest region, <top> the top vertex
             */

            bool closed_region = true;

            /**
             * Lowest region, check if closed.
             */

            if (owner(top) == player) {
                if (str[top] == -1) closed_region = false;
            } else {
                for (auto curedge = outs(top); *curedge != -1; curedge++) {
                    if (!Z[*curedge] and Lower[*curedge]) {
                        closed_region = false;
                        break;
                    }
                }
            }

            if (closed_region) {
                /**
                 * Extract tangles by computing SCCs starting at each top vertex.
                 * Note: each bottom SCC must contain a head vertex.
                 */

                memset(pea_vidx, 0, sizeof(int[nodecount()]));
                pea_curidx = 1;
                changes |= extractTangles(top, Z, str);
            } else {
                /**
                 * Not a closed region, go recursive.
                 */

                std::string px = path;
                path += "-" + std::to_string(pr);
                changes |= search_rec(Z, top, player, Lower);
                path = px;
            }

            Y -= Z;
            Lower -= Z;
        } else {
            // Now recompute the region: reattract to <vtop>,
            // but not via higher (already removed) regions or via the bad vertex <top>

            // Y := remaining region except <top>
            // Lower := remaining region plus remaining lower game

            Y[top] = false; // remove <top> from consideration

            // logger << "Contents of Y2:";
            // for (auto v = Y2.find_first(); v != bitset::npos; v = Y2.find_next(v)) logger << " " << label_vertex(v);
            // logger << std::endl;

            Z[vtop] = true; // add to <Z>
            str[vtop] = -1;
            Q.push(vtop);

            while (Q.nonempty()) {
                const int v = Q.pop();
                attractVertices(player, v, Y, Z, Lower);
                attractTangles(player, v, Y, Z, Lower);
            }

            // Now Z is everything that can go to <vtop> avoiding <top>
            // And Y\Z is everything that must go via <top>

            // Set Y := everything to <vtop> not via <top>
            // Set Z := everything only to <vtop> via <top>

            Y.swap(Z);
            Y[vtop] = false; // but remove <vtop> again
            Z -= Y;
            Z[top] = true;

#ifndef NDEBUG
            if (trace >= 2) {
                // report region
                logger << "\033[1;33mregion\033[m \033[1;36m" << path << "-" << pr << "\033[m";
                for (auto v = Z.find_last(); v != bitset::npos; v = Z.find_prev(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1 and Z[str[v]]) logger << "->" << label_vertex(str[v]);
                }
                logger << std::endl;
            }
#endif

            std::string px = path;
            path += "-" + std::to_string(pr);
            changes |= search_rec(Z, top, player, Lower);
            path = px;
        }

        Z.reset();
    }

    return changes;
}